

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

Abc_Obj_t * Abc_AigMiter2(Abc_Aig_t *pMan,Vec_Ptr_t *vPairs)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *p0;
  long lVar2;
  
  if ((vPairs->nSize & 1) != 0) {
    __assert_fail("vPairs->nSize % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                  ,0x339,"Abc_Obj_t *Abc_AigMiter2(Abc_Aig_t *, Vec_Ptr_t *)");
  }
  if (pMan->pNtkAig->ntkType == ABC_NTK_STRASH) {
    p0 = *(Abc_Obj_t **)((long)pMan->pNtkAig->pManFunc + 8);
    if (0 < vPairs->nSize) {
      lVar2 = 0;
      do {
        pAVar1 = Abc_AigXor(pMan,(Abc_Obj_t *)vPairs->pArray[lVar2],
                            (Abc_Obj_t *)vPairs->pArray[lVar2 + 1]);
        p0 = Abc_AigAnd(pMan,p0,(Abc_Obj_t *)((ulong)pAVar1 ^ 1));
        lVar2 = lVar2 + 2;
      } while ((int)lVar2 < vPairs->nSize);
    }
    return (Abc_Obj_t *)((ulong)p0 ^ 1);
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                ,0x2ad,"Abc_Obj_t *Abc_AigConst1(Abc_Ntk_t *)");
}

Assistant:

Abc_Obj_t * Abc_AigMiter2( Abc_Aig_t * pMan, Vec_Ptr_t * vPairs )
{
    Abc_Obj_t * pMiter, * pXor;
    int i;
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    pMiter = Abc_ObjNot( Abc_AigConst1(pMan->pNtkAig) );
    for ( i = 0; i < vPairs->nSize; i += 2 )
    {
        pXor   = Abc_AigXor( pMan, (Abc_Obj_t *)vPairs->pArray[i], (Abc_Obj_t *)vPairs->pArray[i+1] );
        pMiter = Abc_AigOr( pMan, pMiter, pXor );
    }
    return pMiter;
}